

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Stream::skip(Stream *this)

{
  bool bVar1;
  document_iterator local_28;
  document_iterator e;
  document_iterator i;
  
  e = begin(this);
  local_28.Doc = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0
  ;
  while( true ) {
    bVar1 = document_iterator::operator!=(&e,&local_28);
    if (!bVar1) break;
    Document::skip(((e.Doc)->_M_t).
                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
    document_iterator::operator++(&e);
  }
  return;
}

Assistant:

void Stream::skip() {
  for (document_iterator i = begin(), e = end(); i != e; ++i)
    i->skip();
}